

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui_tables.cpp
# Opt level: O0

void ImGui::TableSortSpecsSanitize(ImGuiTable *table)

{
  short sVar1;
  ImGuiSortDirection IVar2;
  ImGuiTableColumn *pIVar3;
  long in_RDI;
  bool bVar4;
  ImGuiTableColumn *column_1;
  int column_n_3;
  int column_n_2;
  int column_n_1;
  int column_with_smallest_sort_order;
  int sort_n;
  ImU64 fixed_mask;
  bool need_fix_single_sort_order;
  bool need_fix_linearize;
  ImGuiTableColumn *column;
  int column_n;
  ImU64 sort_order_mask;
  int sort_order_count;
  int local_4c;
  int local_48;
  int local_44;
  int local_40;
  int local_3c;
  ulong local_38;
  int local_1c;
  ulong local_18;
  int local_c;
  
  local_c = 0;
  local_18 = 0;
  for (local_1c = 0; local_1c < *(int *)(in_RDI + 0x6c); local_1c = local_1c + 1) {
    pIVar3 = ImSpan<ImGuiTableColumn>::operator[]
                       ((ImSpan<ImGuiTableColumn> *)(in_RDI + 0x18),local_1c);
    if ((pIVar3->SortOrder != -1) && ((pIVar3->IsEnabled & 1U) == 0)) {
      pIVar3->SortOrder = -1;
    }
    if (pIVar3->SortOrder != -1) {
      local_c = local_c + 1;
      local_18 = 1L << ((byte)pIVar3->SortOrder & 0x3f) | local_18;
    }
  }
  bVar4 = false;
  if (1 < local_c) {
    bVar4 = (*(uint *)(in_RDI + 4) & 0x4000000) == 0;
  }
  if ((1L << ((byte)local_c & 0x3f) != local_18 + 1) || (bVar4)) {
    local_38 = 0;
    local_3c = 0;
LAB_00247d6f:
    if (local_3c < local_c) {
      local_40 = -1;
      for (local_44 = 0; local_44 < *(int *)(in_RDI + 0x6c); local_44 = local_44 + 1) {
        if (((local_38 & 1L << ((byte)local_44 & 0x3f)) == 0) &&
           (pIVar3 = ImSpan<ImGuiTableColumn>::operator[]
                               ((ImSpan<ImGuiTableColumn> *)(in_RDI + 0x18),local_44),
           pIVar3->SortOrder != -1)) {
          if (local_40 != -1) {
            pIVar3 = ImSpan<ImGuiTableColumn>::operator[]
                               ((ImSpan<ImGuiTableColumn> *)(in_RDI + 0x18),local_44);
            sVar1 = pIVar3->SortOrder;
            pIVar3 = ImSpan<ImGuiTableColumn>::operator[]
                               ((ImSpan<ImGuiTableColumn> *)(in_RDI + 0x18),local_40);
            if (pIVar3->SortOrder <= sVar1) goto LAB_00247e24;
          }
          local_40 = local_44;
        }
LAB_00247e24:
      }
      local_38 = 1L << ((byte)local_40 & 0x3f) | local_38;
      pIVar3 = ImSpan<ImGuiTableColumn>::operator[]
                         ((ImSpan<ImGuiTableColumn> *)(in_RDI + 0x18),local_40);
      pIVar3->SortOrder = (ImGuiTableColumnIdx)local_3c;
      if (!bVar4) goto LAB_00247ecc;
      local_c = 1;
      for (local_48 = 0; local_48 < *(int *)(in_RDI + 0x6c); local_48 = local_48 + 1) {
        if (local_48 != local_40) {
          pIVar3 = ImSpan<ImGuiTableColumn>::operator[]
                             ((ImSpan<ImGuiTableColumn> *)(in_RDI + 0x18),local_48);
          pIVar3->SortOrder = -1;
        }
      }
    }
  }
  if ((local_c == 0) && ((*(uint *)(in_RDI + 4) & 0x8000000) == 0)) {
    for (local_4c = 0; local_4c < *(int *)(in_RDI + 0x6c); local_4c = local_4c + 1) {
      pIVar3 = ImSpan<ImGuiTableColumn>::operator[]
                         ((ImSpan<ImGuiTableColumn> *)(in_RDI + 0x18),local_4c);
      if (((pIVar3->IsEnabled & 1U) != 0) && ((pIVar3->Flags & 0x200U) == 0)) {
        local_c = 1;
        pIVar3->SortOrder = 0;
        IVar2 = TableGetColumnAvailSortDirection(pIVar3,0);
        pIVar3->field_0x6d =
             pIVar3->field_0x6d & ~(ImGuiSortDirection_Descending|ImGuiSortDirection_Ascending) |
             IVar2 & (ImGuiSortDirection_Descending|ImGuiSortDirection_Ascending);
        break;
      }
    }
  }
  *(short *)(in_RDI + 0x200) = (short)local_c;
  return;
LAB_00247ecc:
  local_3c = local_3c + 1;
  goto LAB_00247d6f;
}

Assistant:

void ImGui::TableSortSpecsSanitize(ImGuiTable* table)
{
    IM_ASSERT(table->Flags & ImGuiTableFlags_Sortable);

    // Clear SortOrder from hidden column and verify that there's no gap or duplicate.
    int sort_order_count = 0;
    ImU64 sort_order_mask = 0x00;
    for (int column_n = 0; column_n < table->ColumnsCount; column_n++)
    {
        ImGuiTableColumn* column = &table->Columns[column_n];
        if (column->SortOrder != -1 && !column->IsEnabled)
            column->SortOrder = -1;
        if (column->SortOrder == -1)
            continue;
        sort_order_count++;
        sort_order_mask |= ((ImU64)1 << column->SortOrder);
        IM_ASSERT(sort_order_count < (int)sizeof(sort_order_mask) * 8);
    }

    const bool need_fix_linearize = ((ImU64)1 << sort_order_count) != (sort_order_mask + 1);
    const bool need_fix_single_sort_order = (sort_order_count > 1) && !(table->Flags & ImGuiTableFlags_SortMulti);
    if (need_fix_linearize || need_fix_single_sort_order)
    {
        ImU64 fixed_mask = 0x00;
        for (int sort_n = 0; sort_n < sort_order_count; sort_n++)
        {
            // Fix: Rewrite sort order fields if needed so they have no gap or duplicate.
            // (e.g. SortOrder 0 disappeared, SortOrder 1..2 exists --> rewrite then as SortOrder 0..1)
            int column_with_smallest_sort_order = -1;
            for (int column_n = 0; column_n < table->ColumnsCount; column_n++)
                if ((fixed_mask & ((ImU64)1 << (ImU64)column_n)) == 0 && table->Columns[column_n].SortOrder != -1)
                    if (column_with_smallest_sort_order == -1 || table->Columns[column_n].SortOrder < table->Columns[column_with_smallest_sort_order].SortOrder)
                        column_with_smallest_sort_order = column_n;
            IM_ASSERT(column_with_smallest_sort_order != -1);
            fixed_mask |= ((ImU64)1 << column_with_smallest_sort_order);
            table->Columns[column_with_smallest_sort_order].SortOrder = (ImGuiTableColumnIdx)sort_n;

            // Fix: Make sure only one column has a SortOrder if ImGuiTableFlags_MultiSortable is not set.
            if (need_fix_single_sort_order)
            {
                sort_order_count = 1;
                for (int column_n = 0; column_n < table->ColumnsCount; column_n++)
                    if (column_n != column_with_smallest_sort_order)
                        table->Columns[column_n].SortOrder = -1;
                break;
            }
        }
    }

    // Fallback default sort order (if no column with the ImGuiTableColumnFlags_DefaultSort flag)
    if (sort_order_count == 0 && !(table->Flags & ImGuiTableFlags_SortTristate))
        for (int column_n = 0; column_n < table->ColumnsCount; column_n++)
        {
            ImGuiTableColumn* column = &table->Columns[column_n];
            if (column->IsEnabled && !(column->Flags & ImGuiTableColumnFlags_NoSort))
            {
                sort_order_count = 1;
                column->SortOrder = 0;
                column->SortDirection = (ImU8)TableGetColumnAvailSortDirection(column, 0);
                break;
            }
        }

    table->SortSpecsCount = (ImGuiTableColumnIdx)sort_order_count;
}